

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FormatFNegativeExpSlow
          (anon_unknown_0 *this,uint128 v,int exp,FormatState *state)

{
  uint128 v_00;
  bool bVar1;
  undefined4 in_register_0000000c;
  FormatState *this_00;
  long local_90;
  anon_class_16_2_466445d9 local_88;
  FunctionRef<void_(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>
  local_78;
  anon_unknown_0 *local_68;
  uint64_t local_60;
  size_t local_50;
  size_t digits_to_go;
  Padding padding;
  size_t total_digits;
  FormatState *state_local;
  int exp_local;
  uint128 v_local;
  
  this_00 = (FormatState *)CONCAT44(in_register_0000000c,exp);
  bVar1 = FormatState::ShouldPrintDot(this_00);
  if (bVar1) {
    local_90 = this_00->precision + 1;
  }
  else {
    local_90 = 0;
  }
  padding.right_spaces = local_90 + 1;
  ExtraWidthToPadding((Padding *)&digits_to_go,
                      padding.right_spaces + (long)(int)(uint)(this_00->sign_char != '\0'),this_00);
  padding.left_spaces = padding.left_spaces + 1;
  FormatSinkImpl::Append(this_00->sink,digits_to_go,' ');
  if (this_00->sign_char != '\0') {
    FormatSinkImpl::Append(this_00->sink,1,this_00->sign_char);
  }
  FormatSinkImpl::Append(this_00->sink,padding.left_spaces,'0');
  bVar1 = FormatState::ShouldPrintDot(this_00);
  if (bVar1) {
    FormatSinkImpl::Append(this_00->sink,1,'.');
  }
  local_50 = this_00->precision;
  local_88.digits_to_go = &local_50;
  local_88.state = this_00;
  local_68 = this;
  local_60 = v.lo_;
  FunctionRef<void(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>
  ::
  FunctionRef<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatFNegativeExpSlow(absl::lts_20250127::uint128,int,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0,void>
            ((FunctionRef<void(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FractionalDigitGenerator)>
              *)&local_78,&local_88);
  v_00.hi_ = local_60;
  v_00.lo_ = (uint64_t)local_68;
  FractionalDigitGenerator::RunConversion(v_00,(int)v.hi_,local_78);
  FormatSinkImpl::Append(this_00->sink,local_50,'0');
  FormatSinkImpl::Append(this_00->sink,padding.zeros,' ');
  return;
}

Assistant:

void FormatFNegativeExpSlow(uint128 v, int exp, const FormatState &state) {
  const size_t total_digits =
      /* 0 */ 1 + (state.ShouldPrintDot() ? state.precision + 1 : 0);
  auto padding =
      ExtraWidthToPadding(total_digits + (state.sign_char ? 1 : 0), state);
  padding.zeros += 1;
  state.sink->Append(padding.left_spaces, ' ');
  if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
  state.sink->Append(padding.zeros, '0');

  if (state.ShouldPrintDot()) state.sink->Append(1, '.');

  // Print digits
  size_t digits_to_go = state.precision;

  FractionalDigitGenerator::RunConversion(
      v, exp, [&](FractionalDigitGenerator digit_gen) {
        // There are no digits to print here.
        if (state.precision == 0) return;

        // We go one digit at a time, while keeping track of runs of nines.
        // The runs of nines are used to perform rounding when necessary.

        while (digits_to_go > 0 && digit_gen.HasMoreDigits()) {
          auto digits = digit_gen.GetDigits();

          // Now we have a digit and a run of nines.
          // See if we can print them all.
          if (digits.num_nines + 1 < digits_to_go) {
            // We don't have to round yet, so print them.
            state.sink->Append(1, digits.digit_before_nine + '0');
            state.sink->Append(digits.num_nines, '9');
            digits_to_go -= digits.num_nines + 1;

          } else {
            // We can't print all the nines, see where we have to truncate.

            bool round_up = false;
            if (digits.num_nines + 1 > digits_to_go) {
              // We round up at a nine. No need to print them.
              round_up = true;
            } else {
              // We can fit all the nines, but truncate just after it.
              if (digit_gen.IsGreaterThanHalf()) {
                round_up = true;
              } else if (digit_gen.IsExactlyHalf()) {
                // Round to even
                round_up =
                    digits.num_nines != 0 || digits.digit_before_nine % 2 == 1;
              }
            }

            if (round_up) {
              state.sink->Append(1, digits.digit_before_nine + '1');
              --digits_to_go;
              // The rest will be zeros.
            } else {
              state.sink->Append(1, digits.digit_before_nine + '0');
              state.sink->Append(digits_to_go - 1, '9');
              digits_to_go = 0;
            }
            return;
          }
        }
      });

  state.sink->Append(digits_to_go, '0');
  state.sink->Append(padding.right_spaces, ' ');
}